

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::MultiTexShader::setUniforms
          (MultiTexShader *this,Context *ctx,deUint32 program)

{
  uint uVar1;
  uint local_a4;
  MultiTexShader *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string ndxStr;
  
  local_a0 = this;
  (*ctx->_vptr_Context[0x76])(ctx,(ulong)program);
  for (local_a4 = 0; (int)local_a4 < *(int *)&(local_a0->super_ShaderProgram).field_0x154;
      local_a4 = local_a4 + 1) {
    de::toString<int>(&ndxStr,(int *)&local_a4);
    std::operator+(&local_78,"u_sampler",&ndxStr);
    uVar1 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)program,local_78._M_dataplus._M_p);
    (*ctx->_vptr_Context[0x5b])(ctx,(ulong)uVar1,(ulong)local_a4);
    std::__cxx11::string::~string((string *)&local_78);
    std::operator+(&local_98,"u_trans",&ndxStr);
    uVar1 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)program,local_98._M_dataplus._M_p);
    tcu::Matrix<float,_3,_3>::getColumnMajorData
              ((Array<float,_9> *)&local_78,
               (local_a0->m_transformations).
               super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (int)local_a4);
    (*ctx->_vptr_Context[100])(ctx,(ulong)uVar1,1,0,&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&ndxStr);
  }
  return;
}

Assistant:

void MultiTexShader::setUniforms (sglr::Context& ctx, deUint32 program) const
{
	ctx.useProgram(program);

	// Sampler and matrix uniforms.

	for (int ndx = 0; ndx < m_numUnits; ndx++)
	{
		string			ndxStr		= de::toString(ndx);

		ctx.uniform1i(ctx.getUniformLocation(program, ("u_sampler" + ndxStr).c_str()), ndx);
		ctx.uniformMatrix3fv(ctx.getUniformLocation(program, ("u_trans" + ndxStr).c_str()), 1, GL_FALSE, (GLfloat*)&m_transformations[ndx].getColumnMajorData()[0]);
	}
}